

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_logs_test.cpp
# Opt level: O1

void __thiscall
metacall_logs_test_DefaultConstructor_Test::TestBody
          (metacall_logs_test_DefaultConstructor_Test *this)

{
  undefined8 *puVar1;
  char *pcVar2;
  int iVar3;
  AssertionResult gtest_ar;
  metacall_log_stdio_type log_stdio;
  Message local_58;
  AssertHelper local_50;
  internal local_48 [8];
  undefined8 *local_40;
  undefined8 local_38;
  
  local_38 = _stdout;
  metacall_print_info();
  iVar3 = 0x32;
  do {
    local_58.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = 0;
    local_50.data_._0_4_ = metacall_log(0,&local_38);
    testing::internal::CmpHelperEQ<int,int>
              (local_48,"(int)0","(int)metacall_log(METACALL_LOG_STDIO, (void *)&log_stdio)",
               (int *)&local_58,(int *)&local_50);
    puVar1 = local_40;
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message(&local_58);
      if (local_40 == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = (char *)*local_40;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/metacall_logs_test/source/metacall_logs_test.cpp"
                 ,0x26,pcVar2);
      testing::internal::AssertHelper::operator=(&local_50,&local_58);
      goto LAB_001085b2;
    }
    if (local_40 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_40 != local_40 + 2) {
        operator_delete((undefined8 *)*local_40);
      }
      operator_delete(puVar1);
    }
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  local_58.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0;
  local_50.data_._0_4_ = metacall_initialize();
  testing::internal::CmpHelperEQ<int,int>
            (local_48,"(int)0","(int)metacall_initialize()",(int *)&local_58,(int *)&local_50);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message(&local_58);
    if (local_40 == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (char *)*local_40;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/metacall_logs_test/source/metacall_logs_test.cpp"
               ,0x29,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,&local_58);
LAB_001085b2:
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((long *)CONCAT44(local_58.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_58.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_58.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_58.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
    if (local_40 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_40 != local_40 + 2) {
        operator_delete((undefined8 *)*local_40);
      }
      operator_delete(local_40);
    }
  }
  else {
    if (local_40 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_40 != local_40 + 2) {
        operator_delete((undefined8 *)*local_40);
      }
      operator_delete(local_40);
    }
    metacall_destroy();
  }
  return;
}

Assistant:

TEST_F(metacall_logs_test, DefaultConstructor)
{
	metacall_log_stdio_type log_stdio = { stdout };

	metacall_print_info();

	for (int i = 0; i < 50; ++i)
	{
		ASSERT_EQ((int)0, (int)metacall_log(METACALL_LOG_STDIO, (void *)&log_stdio));
	}

	ASSERT_EQ((int)0, (int)metacall_initialize());

	metacall_destroy();
}